

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O0

UniquePtr<EC_GROUP> GetCurve(FileTest *t,char *key)

{
  bool bVar1;
  EC_GROUP *pEVar2;
  Message *pMVar3;
  undefined8 in_RDX;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string curve_name;
  char *key_local;
  FileTest *t_local;
  
  curve_name.field_2._8_8_ = in_RDX;
  std::__cxx11::string::string((string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(char *)curve_name.field_2._8_8_,&local_61);
  bVar1 = FileTest::GetAttribute((FileTest *)key,(string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"P-224");
    if (bVar1) {
      pEVar2 = EC_group_p224();
      std::unique_ptr<ec_group_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)t,pEVar2);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"P-256");
      if (bVar1) {
        pEVar2 = EC_group_p256();
        std::unique_ptr<ec_group_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)t,pEVar2);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"P-384");
        if (bVar1) {
          pEVar2 = EC_group_p384();
          std::unique_ptr<ec_group_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)t,pEVar2);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"P-521");
          if (bVar1) {
            pEVar2 = EC_group_p521();
            std::unique_ptr<ec_group_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)t,pEVar2);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"secp160r1");
            if (bVar1) {
              NewSecp160r1Group();
            }
            else {
              testing::Message::Message(&local_80);
              pMVar3 = testing::Message::operator<<(&local_80,(char (*) [16])"Unknown curve: ");
              pMVar3 = testing::Message::operator<<
                                 (pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_40);
              testing::internal::AssertHelper::AssertHelper
                        (&local_88,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0x136,"Failed");
              testing::internal::AssertHelper::operator=(&local_88,pMVar3);
              testing::internal::AssertHelper::~AssertHelper(&local_88);
              testing::Message::~Message(&local_80);
              std::unique_ptr<ec_group_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)t,(nullptr_t)0x0);
            }
          }
        }
      }
    }
  }
  else {
    std::unique_ptr<ec_group_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_group_st,bssl::internal::Deleter> *)t,(nullptr_t)0x0);
  }
  local_78 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

static bssl::UniquePtr<EC_GROUP> GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p224()));
  }
  if (curve_name == "P-256") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p256()));
  }
  if (curve_name == "P-384") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p384()));
  }
  if (curve_name == "P-521") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p521()));
  }
  if (curve_name == "secp160r1") {
    return NewSecp160r1Group();
  }

  ADD_FAILURE() << "Unknown curve: " << curve_name;
  return nullptr;
}